

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O2

void __thiscall util::fs::FileLock::FileLock(FileLock *this,string *filename)

{
  Status SVar1;
  Exception *this_00;
  
  (this->lockfile)._M_dataplus._M_p = (pointer)&(this->lockfile).field_2;
  (this->lockfile)._M_string_length = 0;
  (this->lockfile).field_2._M_local_buf[0] = '\0';
  (this->reason)._M_dataplus._M_p = (pointer)&(this->reason).field_2;
  (this->reason)._M_string_length = 0;
  (this->reason).field_2._M_local_buf[0] = '\0';
  SVar1 = acquire_retry(this,filename,0x32,100);
  if (SVar1 == LOCK_CREATED) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x28);
  Exception::Exception(this_00,&this->reason);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

FileLock::FileLock (std::string const& filename)
{
    switch (this->acquire_retry(filename))
    {
        case LOCK_CREATED: break;
        default: throw util::Exception(this->reason);
    }
}